

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

xmlBufPtr xmlBufCreateSize(size_t size)

{
  xmlBufPtr buf;
  xmlBufferAllocationScheme *pxVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (size == 0xffffffffffffffff) {
LAB_00136226:
    buf = (xmlBufPtr)0x0;
  }
  else {
    buf = (xmlBufPtr)(*xmlMalloc)(0x40);
    if (buf == (xmlBufPtr)0x0) {
      xmlBufMemoryError((xmlBufPtr)0x0,"creating buffer");
      return (xmlBufPtr)0x0;
    }
    buf->use = 0;
    buf->error = 0;
    buf->buffer = (xmlBufferPtr)0x0;
    pxVar1 = __xmlBufferAllocScheme();
    uVar3 = size + 1;
    if (size == 0) {
      uVar3 = 0;
    }
    uVar5 = 0x7fffffff;
    if (uVar3 < 0x7fffffff) {
      uVar5 = uVar3;
    }
    uVar4 = 0x7fffffff;
    if (buf->use < 0x7fffffff) {
      uVar4 = buf->use;
    }
    buf->alloc = *pxVar1;
    buf->size = uVar3;
    buf->compat_size = (uint)uVar5;
    buf->compat_use = (uint)uVar4;
    if (size == 0) {
      buf->content = (xmlChar *)0x0;
    }
    else {
      pxVar2 = (xmlChar *)(*xmlMallocAtomic)(size + 1);
      buf->content = pxVar2;
      if (pxVar2 == (xmlChar *)0x0) {
        xmlBufMemoryError(buf,"creating buffer");
        (*xmlFree)(buf);
        goto LAB_00136226;
      }
      *pxVar2 = '\0';
    }
    buf->contentIO = (xmlChar *)0x0;
  }
  return buf;
}

Assistant:

xmlBufPtr
xmlBufCreateSize(size_t size) {
    xmlBufPtr ret;

    if (size == SIZE_MAX)
        return(NULL);
    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->alloc = xmlBufferAllocScheme;
    ret->size = (size ? size + 1 : 0);         /* +1 for ending null */
    UPDATE_COMPAT(ret);
    if (ret->size){
        ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
        if (ret->content == NULL) {
	    xmlBufMemoryError(ret, "creating buffer");
            xmlFree(ret);
            return(NULL);
        }
        ret->content[0] = 0;
    } else
	ret->content = NULL;
    ret->contentIO = NULL;
    return(ret);
}